

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O2

int assetsys_file_size(assetsys_t *sys,assetsys_file_t file)

{
  char *__dest;
  assetsys_internal_mount_t *paVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  stat sStack_b8;
  
  uVar2 = assetsys_internal_find_mount_index(sys,file.mount,file.path);
  if ((int)uVar2 < 0) {
    iVar3 = 0;
  }
  else {
    paVar1 = sys->mounts + uVar2;
    if (sys->mounts[uVar2].type == ASSETSYS_INTERNAL_MOUNT_TYPE_DIR) {
      __dest = sys->temp;
      pcVar4 = strpool_cstr(&sys->strpool,paVar1->path);
      strcpy(__dest,pcVar4);
      pcVar4 = "/";
      if (sys->temp[0] == '\0') {
        pcVar4 = "";
      }
      strcat(__dest,pcVar4);
      pcVar4 = strpool_cstr(&sys->strpool,
                            sys->collated[paVar1->files[file.index].collated_index].path);
      strcat(__dest,pcVar4 + (long)paVar1->mount_len + 1);
      iVar3 = stat(__dest,&sStack_b8);
      if (iVar3 == 0) {
        paVar1->files[file.index].size = (int)sStack_b8.st_size;
      }
    }
    iVar3 = paVar1->files[file.index].size;
  }
  return iVar3;
}

Assistant:

int assetsys_file_size( assetsys_t* sys, assetsys_file_t file )
    {
    int mount_index = assetsys_internal_find_mount_index( sys, file.mount, file.path );
    if( mount_index < 0 ) return 0;

    struct assetsys_internal_mount_t* mount = &sys->mounts[ mount_index ];
    if( mount->type == ASSETSYS_INTERNAL_MOUNT_TYPE_DIR )
        {
        strcpy( sys->temp, assetsys_internal_get_string( sys, mount->path ) );
        strcat( sys->temp, *sys->temp == '\0' ? "" : "/" );
        strcat( sys->temp, assetsys_internal_get_string( sys, 
            sys->collated[ mount->files[ file.index ].collated_index ].path ) + mount->mount_len + 1 );
        struct stat s;
        if( stat( sys->temp, &s ) == 0 )
            mount->files[ file.index ].size = (int) s.st_size;
        }
        
    return mount->files[ file.index ].size;
    }